

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O0

bool __thiscall MetaCommand::GetValueAsBool(MetaCommand *this,Option *option,string *fieldName)

{
  bool bVar1;
  __type _Var2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  string *in_RSI;
  const_iterator itField;
  string fieldname;
  vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff74;
  undefined1 in_stack_ffffffffffffff75;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
  local_58 [3];
  string local_40 [63];
  byte local_1;
  
  std::__cxx11::string::string(local_40,(string *)in_RDX);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    std::__cxx11::string::operator=(local_40,in_RSI);
  }
  std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::begin
            (in_stack_ffffffffffffff68);
  __gnu_cxx::
  __normal_iterator<MetaCommand::Field_const*,std::vector<MetaCommand::Field,std::allocator<MetaCommand::Field>>>
  ::__normal_iterator<MetaCommand::Field*>
            ((__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
              *)CONCAT17(in_stack_ffffffffffffff77,
                         CONCAT16(in_stack_ffffffffffffff76,
                                  CONCAT15(in_stack_ffffffffffffff75,
                                           CONCAT14(in_stack_ffffffffffffff74,
                                                    in_stack_ffffffffffffff70)))),
             (__normal_iterator<MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
              *)in_stack_ffffffffffffff68);
  do {
    std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::end
              (in_stack_ffffffffffffff68);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff77,
                                   CONCAT16(in_stack_ffffffffffffff76,
                                            CONCAT15(in_stack_ffffffffffffff75,
                                                     CONCAT14(in_stack_ffffffffffffff74,
                                                              in_stack_ffffffffffffff70)))),
                       (__normal_iterator<MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) {
      local_1 = 0;
LAB_00126825:
      std::__cxx11::string::~string(local_40);
      return (bool)(local_1 & 1);
    }
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
    ::operator*(local_58);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDX);
    if (_Var2) {
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
      ::operator*(local_58);
      uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                              (char *)in_stack_ffffffffffffff68);
      if (!(bool)uVar3) {
        __gnu_cxx::
        __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
        ::operator*(local_58);
        uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff76,
                                                         CONCAT15(in_stack_ffffffffffffff75,
                                                                  CONCAT14(in_stack_ffffffffffffff74
                                                                           ,
                                                  in_stack_ffffffffffffff70)))),
                                (char *)in_stack_ffffffffffffff68);
        if (!(bool)uVar4) {
          __gnu_cxx::
          __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
          ::operator*(local_58);
          uVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(
                                                  in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           in_stack_ffffffffffffff70)))),
                                  (char *)in_stack_ffffffffffffff68);
          if (!(bool)uVar5) {
            __gnu_cxx::
            __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
            ::operator*(local_58);
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(uVar5,CONCAT14(
                                                  in_stack_ffffffffffffff74,
                                                  in_stack_ffffffffffffff70)))),
                                    (char *)in_stack_ffffffffffffff68);
            if (!bVar1) {
              local_1 = 0;
              goto LAB_00126825;
            }
          }
        }
      }
      local_1 = 1;
      goto LAB_00126825;
    }
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
    ::operator++(local_58);
  } while( true );
}

Assistant:

bool MetaCommand::GetValueAsBool(Option option,METAIO_STL::string fieldName)
{
  METAIO_STL::string fieldname = fieldName;
  if (fieldName.empty()) {
    fieldname = option.name;
  }

  METAIO_STL::vector<Field>::const_iterator itField = option.fields.begin();
  while(itField != option.fields.end())
    {
    if((*itField).name == fieldname)
      {
      if((*itField).value == "true"
         || (*itField).value == "1"
         || (*itField).value == "True"
         || (*itField).value == "TRUE"
        )
        {
        return true;
        }
      return false;
      }
    ++itField;
    }
  return false;
}